

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdr.cpp
# Opt level: O3

void __thiscall neueda::cdr::setArray(cdr *this,cdrKey_t *key,cdrArray *value)

{
  itemMap *this_00;
  size_type sVar1;
  mapped_type *pmVar2;
  
  this_00 = &this->mItems;
  sVar1 = std::
          map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
          ::count(this_00,key);
  if (sVar1 != 0) {
    pmVar2 = std::
             map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
             ::operator[](this_00,key);
    if (pmVar2->mType == CDR_ARRAY) goto LAB_00106872;
  }
  emptyArray(this,key);
LAB_00106872:
  pmVar2 = std::
           map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
           ::operator[](this_00,key);
  if (pmVar2->mType == CDR_STRING) {
    (pmVar2->mString)._M_string_length = 0;
    *(pmVar2->mString)._M_dataplus._M_p = '\0';
  }
  std::vector<neueda::cdr,_std::allocator<neueda::cdr>_>::operator=(&pmVar2->mArray,value);
  return;
}

Assistant:

void
cdr::setArray (const cdrKey_t& key, cdrArray value)
{
    if (mItems.count (key) == 0 || mItems[key].mType != CDR_ARRAY)
        emptyArray (key);
    cdrItem* item = &mItems[key];
    if (item->mType == CDR_STRING)
        item->mString.clear ();
    item->mArray = value;
}